

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicon.cpp
# Opt level: O1

QDataStream * operator<<(QDataStream *s,QIcon *icon)

{
  QIconEngine *pQVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  QExplicitlySharedDataPointer<QPlatformPixmap> local_38;
  QSize local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(s + 0x18) < 9) {
    if (*(int *)(s + 0x18) == 8) {
      if (icon->d != (QIconPrivate *)0x0) {
        iVar2 = (*icon->d->engine->_vptr_QIconEngine[0xd])();
        if ((char)iVar2 == '\0') {
          pQVar1 = icon->d->engine;
          uVar4 = (uint)pQVar1[3]._vptr_QIconEngine;
          QDataStream::operator<<(s,uVar4);
          if (0 < (int)uVar4) {
            uVar5 = (ulong)(uVar4 & 0x7fffffff);
            lVar3 = 0;
            do {
              operator<<(s,(QPixmap *)((long)pQVar1[2]._vptr_QIconEngine + lVar3));
              operator<<(s,(QString *)((long)pQVar1[2]._vptr_QIconEngine + lVar3 + 0x18));
              operator<<(s,(QSize *)((long)pQVar1[2]._vptr_QIconEngine + lVar3 + 0x30));
              QDataStream::operator<<(s,*(int *)((long)pQVar1[2]._vptr_QIconEngine + lVar3 + 0x38));
              QDataStream::operator<<(s,*(int *)((long)pQVar1[2]._vptr_QIconEngine + lVar3 + 0x3c));
              lVar3 = lVar3 + 0x40;
              uVar5 = uVar5 - 1;
            } while (uVar5 != 0);
          }
          goto LAB_00273761;
        }
      }
      QDataStream::operator<<(s,0);
    }
    else {
      local_30.wd.m_i = 0x16;
      local_30.ht.m_i = 0x16;
      QIcon::pixmap((QPixmap *)local_48,icon,&local_30,Normal,Off);
      operator<<(s,(QPixmap *)local_48);
      QPixmap::~QPixmap((QPixmap *)local_48);
    }
  }
  else {
    if (icon->d != (QIconPrivate *)0x0) {
      iVar2 = (*icon->d->engine->_vptr_QIconEngine[0xd])();
      if ((char)iVar2 == '\0') {
        (*icon->d->engine->_vptr_QIconEngine[7])(local_48);
        operator<<(s,(QString *)local_48);
        if ((QArrayData *)local_48._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_48._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_48._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_48._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_48._0_8_,2,0x10);
          }
        }
        pQVar1 = icon->d->engine;
        (*pQVar1->_vptr_QIconEngine[10])(pQVar1,s);
        goto LAB_00273761;
      }
    }
    local_48._0_8_ = (QArrayData *)0x0;
    local_48._8_8_ = (char16_t *)0x0;
    local_38.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)(QPlatformPixmap *)0x0;
    operator<<(s,(QString *)local_48);
    if ((QArrayData *)local_48._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_48._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_48._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_48._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_48._0_8_,2,0x10);
      }
    }
  }
LAB_00273761:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator<<(QDataStream &s, const QIcon &icon)
{
    if (s.version() >= QDataStream::Qt_4_3) {
        if (icon.isNull()) {
            s << QString();
        } else {
            s << icon.d->engine->key();
            icon.d->engine->write(s);
        }
    } else if (s.version() == QDataStream::Qt_4_2) {
        if (icon.isNull()) {
            s << 0;
        } else {
            QPixmapIconEngine *engine = static_cast<QPixmapIconEngine *>(icon.d->engine);
            int num_entries = engine->pixmaps.size();
            s << num_entries;
            for (int i=0; i < num_entries; ++i) {
                s << engine->pixmaps.at(i).pixmap;
                s << engine->pixmaps.at(i).fileName;
                s << engine->pixmaps.at(i).size;
                s << (uint) engine->pixmaps.at(i).mode;
                s << (uint) engine->pixmaps.at(i).state;
            }
        }
    } else {
        s << QPixmap(icon.pixmap(22,22));
    }
    return s;
}